

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O3

int * inform_black_box(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,int *box,
                      inform_error *err)

{
  void *__dest;
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  _Bool _Var5;
  size_t i;
  size_t sVar6;
  int *__ptr;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  int *piVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  void *local_90;
  int *local_60;
  
  _Var5 = check_arguments(series,l,n,m,b,r,s,err);
  if (_Var5) {
    return (int *)0x0;
  }
  if (s == (size_t *)0x0 && r != (size_t *)0x0) {
    uVar16 = 1;
    if (l == 0) {
LAB_00108ef6:
      uVar16 = 1;
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      sVar6 = 0;
      do {
        if (uVar16 < r[sVar6]) {
          uVar16 = r[sVar6];
        }
        sVar6 = sVar6 + 1;
      } while (l != sVar6);
    }
  }
  else if (s == (size_t *)0x0 || r != (size_t *)0x0) {
    uVar16 = 1;
    uVar9 = 0;
    if (((r != (size_t *)0x0) && (uVar9 = 0, l != 0)) && (s != (size_t *)0x0)) {
      uVar9 = 0;
      sVar6 = 0;
      do {
        if (uVar16 < r[sVar6]) {
          uVar16 = r[sVar6];
        }
        if (uVar9 < s[sVar6]) {
          uVar9 = s[sVar6];
        }
        sVar6 = sVar6 + 1;
      } while (l != sVar6);
    }
  }
  else {
    uVar16 = 1;
    if (l == 0) goto LAB_00108ef6;
    uVar9 = 0;
    sVar6 = 0;
    do {
      if (uVar9 < s[sVar6]) {
        uVar9 = s[sVar6];
      }
      sVar6 = sVar6 + 1;
    } while (l != sVar6);
  }
  if (box == (int *)0x0) {
    __ptr = (int *)calloc((((m - uVar16) - uVar9) + 1) * n,4);
    if (__ptr == (int *)0x0) {
      if (err == (inform_error *)0x0) {
        return (int *)0x0;
      }
      *err = INFORM_ENOMEM;
      return (int *)0x0;
    }
    local_90 = calloc(l * 2,8);
    if (local_90 != (void *)0x0) goto LAB_00108fa8;
    free(__ptr);
  }
  else {
    local_90 = calloc(l * 2,8);
    __ptr = box;
    if (local_90 != (void *)0x0) {
LAB_00108fa8:
      auVar4 = _DAT_0010a080;
      if (r == (size_t *)0x0) {
        if (l != 0) {
          lVar10 = l - 1;
          auVar18._8_4_ = (int)lVar10;
          auVar18._0_8_ = lVar10;
          auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
          uVar7 = 0;
          auVar18 = auVar18 ^ _DAT_0010a080;
          auVar19 = _DAT_0010a070;
          do {
            auVar20 = auVar19 ^ auVar4;
            if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                        auVar18._4_4_ < auVar20._4_4_) & 1)) {
              *(undefined8 *)((long)local_90 + uVar7 * 8) = 1;
            }
            if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
                auVar20._12_4_ <= auVar18._12_4_) {
              *(undefined8 *)((long)local_90 + uVar7 * 8 + 8) = 1;
            }
            uVar7 = uVar7 + 2;
            lVar10 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 2;
            auVar19._8_8_ = lVar10 + 2;
          } while ((l + 1 & 0xfffffffffffffffe) != uVar7);
        }
      }
      else {
        memcpy(local_90,r,l * 8);
      }
      __dest = (void *)((long)local_90 + l * 8);
      if (s != (size_t *)0x0) {
        memcpy(__dest,s,l * 8);
      }
      lVar10 = ((m - uVar16) - uVar9) + 1;
      if (lVar10 * n != 0) {
        memset(__ptr,0,lVar10 * n * 4);
      }
      if (l != 0) {
        local_60 = series + uVar16;
        sVar6 = 0;
        do {
          if (n != 0) {
            lVar2 = *(long *)((long)local_90 + sVar6 * 8);
            lVar3 = *(long *)((long)__dest + sVar6 * 8);
            piVar11 = local_60 + -lVar2;
            piVar13 = local_60 + lVar3;
            sVar15 = 0;
            piVar8 = __ptr + 1;
            do {
              if (uVar16 - lVar2 < lVar3 + uVar16) {
                iVar12 = 1;
                lVar14 = 0;
                iVar17 = 0;
                do {
                  iVar12 = iVar12 * b[sVar6];
                  iVar17 = iVar17 * b[sVar6] + piVar11[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar2 + lVar3 != lVar14);
              }
              else {
                iVar12 = 1;
                iVar17 = 0;
              }
              __ptr[sVar15 * lVar10] = __ptr[sVar15 * lVar10] * iVar12 + iVar17;
              if (uVar16 < m - uVar9) {
                lVar14 = 0;
                do {
                  iVar17 = (iVar17 * b[sVar6] - piVar11[lVar14] * iVar12) + piVar13[lVar14];
                  piVar8[lVar14] = piVar8[lVar14] * iVar12 + iVar17;
                  lVar1 = lVar14 + uVar16;
                  lVar14 = lVar14 + 1;
                } while (lVar1 + 1U < m - uVar9);
              }
              sVar15 = sVar15 + 1;
              piVar11 = piVar11 + m;
              piVar8 = piVar8 + lVar10;
              piVar13 = piVar13 + m;
            } while (sVar15 != n);
          }
          sVar6 = sVar6 + 1;
          local_60 = local_60 + m * n;
        } while (sVar6 != l);
      }
      _Var5 = inform_failed(err);
      piVar13 = (int *)0x0;
      if (!_Var5) {
        piVar13 = __ptr;
      }
      if (_Var5 && box == (int *)0x0) {
        free(__ptr);
        piVar13 = (int *)0x0;
      }
      free(local_90);
      return piVar13;
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (int *)0x0;
}

Assistant:

int* inform_black_box(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, int *box, inform_error *err)
{
    if (check_arguments(series, l, n, m, b, r, s, err))
    {
        return NULL;
    }
    size_t max_r, max_s;
    compute_lengths(r, s, l, &max_r, &max_s);

    bool allocate = (box == NULL);
    if (allocate)
    {
        box = calloc(n * (m - max_r - max_s + 1), sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t *data = calloc(2 * l, sizeof(size_t));
    if (data == NULL)
    {
        if (allocate) free(box);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    size_t *history = data;
    if (r == NULL)
    {
        for (size_t i = 0; i < l; ++i) history[i] = 1;
    }
    else
    {
        memcpy(history, r, l * sizeof(size_t));
    }

    size_t *future = data + l;
    if (s != NULL)
    {
        memcpy(future, s, l * sizeof(size_t));
    }

    accumulate(series, l, n, m, b, history, future, max_r, max_s, box, err);

    if (inform_failed(err))
    {
        if (allocate) free(box);
        box = NULL;
    }
    free(data);
    return box;
}